

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O2

void Rwr_CutIsBoolean_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLeaves,int fMarkA)

{
  int iVar1;
  uint uVar2;
  
  while( true ) {
    iVar1 = Vec_PtrFind(vLeaves,pObj);
    if (-1 < iVar1) break;
    iVar1 = Vec_PtrFind(vLeaves,(void *)((ulong)pObj ^ 1));
    if (-1 < iVar1) break;
    uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
    if ((uVar2 == 5) || (uVar2 == 2)) {
      __assert_fail("!Abc_ObjIsCi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwr/rwrEva.c"
                    ,0x16b,"void Rwr_CutIsBoolean_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    Rwr_CutIsBoolean_rec
              ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vLeaves,fMarkA);
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]];
  }
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | (uint)(fMarkA == 0) * 0x10 + 0x10;
  return;
}

Assistant:

void Rwr_CutIsBoolean_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLeaves, int fMarkA )
{
    if ( Vec_PtrFind(vLeaves, pObj) >= 0 || Vec_PtrFind(vLeaves, Abc_ObjNot(pObj)) >= 0 )
    {
        if ( fMarkA )
            pObj->fMarkA = 1;
        else
            pObj->fMarkB = 1;
        return;
    }
    assert( !Abc_ObjIsCi(pObj) );
    Rwr_CutIsBoolean_rec( Abc_ObjFanin0(pObj), vLeaves, fMarkA );
    Rwr_CutIsBoolean_rec( Abc_ObjFanin1(pObj), vLeaves, fMarkA );
}